

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsGraph.h
# Opt level: O0

bool __thiscall
dg::vr::RelationsGraph<dg::vr::ValueRelations>::addRelation
          (RelationsGraph<dg::vr::ValueRelations> *this,Bucket *lt,Type type,Bucket *rt,
          Relations *maybeBetween)

{
  __normal_iterator<std::reference_wrapper<dg::vr::Bucket>_*,_std::vector<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>_>
  __x;
  bool bVar1;
  undefined8 in_RCX;
  Type in_EDX;
  Bucket *in_RSI;
  Bucket *in_R8;
  Type in_stack_00000014;
  Bucket *in_stack_00000018;
  Bucket *in_stack_00000020;
  RelationsGraph<dg::vr::ValueRelations> *in_stack_00000028;
  __normal_iterator<std::reference_wrapper<dg::vr::Bucket>_*,_std::vector<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>_>
  it;
  Bucket *first;
  BucketSet intersect;
  Type rel;
  const_iterator __end4;
  const_iterator __begin4;
  initializer_list<dg::vr::Relations::Type> *__range4;
  Relations between;
  Bucket *mRt;
  Bucket *mLt;
  undefined4 in_stack_fffffffffffffec8;
  Type in_stack_fffffffffffffecc;
  Bucket *in_stack_fffffffffffffed0;
  Bucket *in_stack_fffffffffffffed8;
  Bucket *in_stack_fffffffffffffee0;
  Bucket *in_stack_fffffffffffffee8;
  RelationsGraph<dg::vr::ValueRelations> *in_stack_fffffffffffffef0;
  Bucket *lt_00;
  Bucket *in_stack_fffffffffffffef8;
  Bucket *in_stack_ffffffffffffff00;
  Bucket *in_stack_ffffffffffffff08;
  RelationsGraph<dg::vr::ValueRelations> *in_stack_ffffffffffffff10;
  __normal_iterator<std::reference_wrapper<dg::vr::Bucket>_*,_std::vector<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>_>
  local_b8;
  __normal_iterator<std::reference_wrapper<dg::vr::Bucket>_*,_std::vector<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>_>
  local_b0;
  Bucket *local_a8;
  Type local_84;
  const_iterator local_80;
  const_iterator local_78;
  Type local_70 [4];
  initializer_list<dg::vr::Relations::Type> local_60;
  initializer_list<dg::vr::Relations::Type> *local_50;
  bitset<12UL> local_48;
  Type TVar2;
  Type TVar3;
  undefined4 in_stack_ffffffffffffffe0;
  
  lt_00 = in_RSI;
  local_48.super__Base_bitset<1UL>._M_w =
       (_Base_bitset<1UL>)
       fromMaybeBetween((RelationsGraph<dg::vr::ValueRelations> *)in_stack_fffffffffffffee8,
                        in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                        (Relations *)in_stack_fffffffffffffed0);
  bVar1 = areRelated(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                     (Type)((ulong)in_stack_fffffffffffffee0 >> 0x20),in_stack_fffffffffffffed8,
                     (Relations *)in_stack_fffffffffffffed0);
  TVar2 = (Type)((ulong)in_RCX >> 0x20);
  if (bVar1) {
    return false;
  }
  switch(in_EDX) {
  case EQ:
    bVar1 = Bucket::hasRelation(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
    if ((bVar1) &&
       (bVar1 = Bucket::hasRelation(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc), bVar1)) {
      Bucket::getRelated(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
      Bucket::getRelated(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
      addRelation((RelationsGraph<dg::vr::ValueRelations> *)lt_00,
                  (Bucket *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),TVar2,in_R8,
                  (Relations *)in_RSI);
    }
    bVar1 = setEqual(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
    return bVar1;
  case NE:
    local_70[0] = SLT;
    local_70[1] = 5;
    local_70[2] = 7;
    local_70[3] = 9;
    local_60._M_array = local_70;
    local_60._M_len = 4;
    local_50 = &local_60;
    local_78 = std::initializer_list<dg::vr::Relations::Type>::begin(local_50);
    local_80 = std::initializer_list<dg::vr::Relations::Type>::end
                         ((initializer_list<dg::vr::Relations::Type> *)in_stack_fffffffffffffed0);
    for (; local_78 != local_80; local_78 = local_78 + 1) {
      local_84 = *local_78;
      bVar1 = areRelated(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                         (Type)((ulong)in_stack_fffffffffffffee0 >> 0x20),in_stack_fffffffffffffed8,
                         (Relations *)in_stack_fffffffffffffed0);
      if (bVar1) {
        return false;
      }
      dg::vr::Relations::getNonStrict(local_84);
      bVar1 = areRelated(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                         (Type)((ulong)in_stack_fffffffffffffee0 >> 0x20),in_stack_fffffffffffffed8,
                         (Relations *)in_stack_fffffffffffffed0);
      TVar2 = (Type)((ulong)in_stack_ffffffffffffff00 >> 0x20);
      TVar3 = (Type)((ulong)in_RCX >> 0x20);
      if (bVar1) {
        dg::vr::Relations::getNonStrict(local_84);
        unsetRelated(in_stack_ffffffffffffff08,TVar2,in_stack_fffffffffffffef8);
        bVar1 = addRelation((RelationsGraph<dg::vr::ValueRelations> *)lt_00,
                            (Bucket *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),TVar3,in_R8,
                            (Relations *)in_RSI);
        return bVar1;
      }
    }
    break;
  case SLE:
  case ULE:
    bVar1 = areRelated(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                       (Type)((ulong)in_stack_fffffffffffffee0 >> 0x20),in_stack_fffffffffffffed8,
                       (Relations *)in_stack_fffffffffffffed0);
    if (bVar1) {
      unsetRelated(in_stack_ffffffffffffff08,(Type)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                   in_stack_fffffffffffffef8);
      dg::vr::Relations::getStrict(in_EDX);
      bVar1 = addRelation((RelationsGraph<dg::vr::ValueRelations> *)lt_00,
                          (Bucket *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),TVar2,in_R8,
                          (Relations *)in_RSI);
      return bVar1;
    }
    dg::vr::Relations::inverted(in_EDX);
    bVar1 = areRelated((RelationsGraph<dg::vr::ValueRelations> *)lt_00,in_stack_fffffffffffffee8,
                       (Type)((ulong)in_stack_fffffffffffffee0 >> 0x20),in_stack_fffffffffffffed8,
                       (Relations *)in_stack_fffffffffffffed0);
    if (bVar1) {
      dg::vr::Relations::inverted(in_EDX);
      getIntersectingNonstrict
                (in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000014);
      local_b0._M_current =
           (reference_wrapper<dg::vr::Bucket> *)
           VectorSet<std::reference_wrapper<dg::vr::Bucket>_>::begin
                     ((VectorSet<std::reference_wrapper<dg::vr::Bucket>_> *)
                      CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      __gnu_cxx::
      __normal_iterator<std::reference_wrapper<dg::vr::Bucket>_*,_std::vector<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>_>
      ::operator*(&local_b0);
      local_a8 = std::reference_wrapper::operator_cast_to_Bucket_
                           ((reference_wrapper<dg::vr::Bucket> *)0x1e5b61);
      VectorSet<std::reference_wrapper<dg::vr::Bucket>_>::begin
                ((VectorSet<std::reference_wrapper<dg::vr::Bucket>_> *)
                 CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      __x._M_current._4_4_ = in_stack_fffffffffffffecc;
      __x._M_current._0_4_ = in_stack_fffffffffffffec8;
      local_b8 = std::
                 next<__gnu_cxx::__normal_iterator<std::reference_wrapper<dg::vr::Bucket>*,std::vector<std::reference_wrapper<dg::vr::Bucket>,std::allocator<std::reference_wrapper<dg::vr::Bucket>>>>>
                           (__x,0x1e5b8a);
      while( true ) {
        VectorSet<std::reference_wrapper<dg::vr::Bucket>_>::end
                  ((VectorSet<std::reference_wrapper<dg::vr::Bucket>_> *)
                   CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<std::reference_wrapper<dg::vr::Bucket>_*,_std::vector<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>_>
                            *)in_stack_fffffffffffffed0,
                           (__normal_iterator<std::reference_wrapper<dg::vr::Bucket>_*,_std::vector<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>_>
                            *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
        if (!bVar1) break;
        __gnu_cxx::
        __normal_iterator<std::reference_wrapper<dg::vr::Bucket>_*,_std::vector<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>_>
        ::operator*(&local_b8);
        std::reference_wrapper::operator_cast_to_Bucket_
                  ((reference_wrapper<dg::vr::Bucket> *)0x1e5bde);
        setEqual(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
        __gnu_cxx::
        __normal_iterator<std::reference_wrapper<dg::vr::Bucket>_*,_std::vector<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>_>
        ::operator++(&local_b8);
      }
      VectorSet<std::reference_wrapper<dg::vr::Bucket>_>::~VectorSet
                ((VectorSet<std::reference_wrapper<dg::vr::Bucket>_> *)0x1e5c14);
      return true;
    }
    break;
  case SLT:
  case ULT:
    dg::vr::Relations::getNonStrict(in_EDX);
    TVar3 = (Type)((ulong)in_RSI >> 0x20);
    TVar2 = (Type)((ulong)in_stack_ffffffffffffff00 >> 0x20);
    bVar1 = areRelated(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                       (Type)((ulong)in_stack_fffffffffffffee0 >> 0x20),in_stack_fffffffffffffed8,
                       (Relations *)in_stack_fffffffffffffed0);
    if (bVar1) {
      TVar2 = TVar3;
      dg::vr::Relations::getNonStrict(in_EDX);
      unsetRelated(lt_00,TVar2,in_stack_fffffffffffffef8);
    }
    bVar1 = areRelated(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                       (Type)((ulong)in_stack_fffffffffffffee0 >> 0x20),in_stack_fffffffffffffed8,
                       (Relations *)in_stack_fffffffffffffed0);
    if (bVar1) {
      unsetRelated(lt_00,TVar2,in_stack_fffffffffffffef8);
    }
    break;
  case SGE:
  case SGT:
  case UGE:
  case UGT:
  case PF:
    dg::vr::Relations::invert();
    dg::vr::Relations::inverted(in_EDX);
    bVar1 = addRelation((RelationsGraph<dg::vr::ValueRelations> *)lt_00,
                        (Bucket *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),TVar2,in_R8,
                        (Relations *)in_RSI);
    return bVar1;
  case PT:
    bVar1 = Bucket::hasRelation(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
    if (bVar1) {
      Bucket::getRelated(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
      bVar1 = addRelation((RelationsGraph<dg::vr::ValueRelations> *)lt_00,
                          (Bucket *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),TVar2,in_R8,
                          (Relations *)in_RSI);
      return bVar1;
    }
  }
  setRelated(in_stack_fffffffffffffee0,(Type)((ulong)in_stack_fffffffffffffed8 >> 0x20),
             in_stack_fffffffffffffed0);
  return true;
}

Assistant:

bool addRelation(const Bucket &lt, Relations::Type type, const Bucket &rt,
                     Relations *maybeBetween = nullptr) {
        Bucket &mLt = const_cast<Bucket &>(lt);
        Bucket &mRt = const_cast<Bucket &>(rt);

        Relations between = fromMaybeBetween(lt, rt, maybeBetween);
        if (areRelated(lt, type, rt, &between))
            return false;
        assert(!haveConflictingRelation(lt, type, rt, &between));

        switch (type) {
        case Relations::EQ:
            if (lt.hasRelation(Relations::PT) &&
                rt.hasRelation(Relations::PT)) {
                addRelation(lt.getRelated(Relations::PT), Relations::EQ,
                            rt.getRelated(Relations::PT));
            }
            return setEqual(mLt, mRt);

        case Relations::NE:
            for (Relations::Type rel : {Relations::SLT, Relations::ULT,
                                        Relations::SGT, Relations::UGT}) {
                if (areRelated(lt, rel, rt))
                    return false;
                if (areRelated(lt, Relations::getNonStrict(rel), rt,
                               &between)) {
                    unsetRelated(mLt, Relations::getNonStrict(rel), mRt);
                    return addRelation(lt, rel, rt, &between);
                }
            }
            break; // jump after switch

        case Relations::SLT:
        case Relations::ULT:
            if (areRelated(lt, Relations::getNonStrict(type), rt, &between))
                unsetRelated(mLt, Relations::getNonStrict(type), mRt);
            if (areRelated(lt, Relations::NE, rt, &between))
                unsetRelated(mLt, Relations::NE, mRt);
            break; // jump after switch

        case Relations::SLE:
        case Relations::ULE:
            if (areRelated(lt, Relations::NE, rt, &between)) {
                unsetRelated(mLt, Relations::NE, mRt);
                return addRelation(lt, Relations::getStrict(type), rt,
                                   &between);
            }
            if (areRelated(lt, Relations::inverted(type), rt, &between)) {
                Bucket::BucketSet intersect = getIntersectingNonstrict(
                        lt, rt, Relations::inverted(type));
                assert(intersect.size() >= 2);
                Bucket &first = *intersect.begin();
                for (auto it = std::next(intersect.begin());
                     it != intersect.end(); ++it)
                    setEqual(first, *it);
                return true;
            }
            break; // jump after switch

        case Relations::PT:
            if (lt.hasRelation(type))
                return addRelation(lt.getRelated(type), Relations::EQ, rt);
            break; // jump after switch

        case Relations::SGT:
        case Relations::SGE:
        case Relations::UGT:
        case Relations::UGE:
        case Relations::PF: {
            between.invert();
            return addRelation(rt, Relations::inverted(type), lt, &between);
        }
        }
        setRelated(mLt, type, mRt);
        return true;
    }